

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_SeeJSON.c
# Opt level: O0

void test_for_access_string(void)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 local_28 [8];
  json_node node;
  
  json_init((json_node *)local_28);
  json_set_string((json_node *)local_28,"",0);
  cases_total = cases_total + 1;
  sVar3 = json_get_string_length((json_node *)local_28);
  if (sVar3 == 0) {
    pcVar4 = json_get_string((json_node *)local_28);
    sVar3 = json_get_string_length((json_node *)local_28);
    iVar2 = memcmp("",pcVar4,sVar3 + 1);
    if (iVar2 != 0) goto LAB_0010d28a;
    cases_passed = cases_passed + 1;
  }
  else {
LAB_0010d28a:
    pFVar1 = _stderr;
    pcVar4 = json_get_string((json_node *)local_28);
    fprintf(pFVar1,"%s:%d\nExpect for: %s \nBut actually get: %s\n\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lrx0014[P]SeeJson/src/Test_SeeJSON.c"
            ,0x1cf,"",pcVar4);
    status = 1;
  }
  json_set_string((json_node *)local_28,"hello",5);
  cases_total = cases_total + 1;
  sVar3 = json_get_string_length((json_node *)local_28);
  if (sVar3 == 5) {
    pcVar4 = json_get_string((json_node *)local_28);
    sVar3 = json_get_string_length((json_node *)local_28);
    iVar2 = memcmp("hello",pcVar4,sVar3 + 1);
    if (iVar2 == 0) {
      cases_passed = cases_passed + 1;
      goto LAB_0010d39b;
    }
  }
  pFVar1 = _stderr;
  pcVar4 = json_get_string((json_node *)local_28);
  fprintf(pFVar1,"%s:%d\nExpect for: %s \nBut actually get: %s\n\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lrx0014[P]SeeJson/src/Test_SeeJSON.c"
          ,0x1d1,"hello",pcVar4);
  status = 1;
LAB_0010d39b:
  json_free((json_node *)local_28);
  return;
}

Assistant:

static void test_for_access_string()
{
    json_node node;
    json_init(&node);
    json_set_string(&node,"",0);
    TEST_STRING_IS_RIGHT("",json_get_string(&node),json_get_string_length(&node));
    json_set_string(&node,"hello",5);
    TEST_STRING_IS_RIGHT("hello",json_get_string(&node),json_get_string_length(&node));
    json_free(&node);
}